

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void __thiscall ImGuiListClipper::Begin(ImGuiListClipper *this,int count,float items_height)

{
  float in_ESI;
  int *in_RDI;
  float in_XMM0_Da;
  ImGuiWindow *window;
  ImGuiContext *g;
  int *in_stack_00000028;
  float in_stack_00000030;
  int in_stack_00000034;
  
  in_RDI[5] = (int)(GImGui->CurrentWindow->DC).CursorPos.y;
  in_RDI[4] = (int)in_XMM0_Da;
  in_RDI[2] = (int)in_ESI;
  in_RDI[3] = 0;
  *in_RDI = -1;
  in_RDI[1] = -1;
  if (0.0 < (float)in_RDI[4]) {
    ImGui::CalcListClipping
              (in_stack_00000034,in_stack_00000030,in_stack_00000028,&this->DisplayStart);
    if (0 < *in_RDI) {
      SetCursorPosYAndSetupDummyPrevLine(in_ESI,in_XMM0_Da);
    }
    in_RDI[3] = 2;
  }
  return;
}

Assistant:

void ImGuiListClipper::Begin(int count, float items_height)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    StartPosY = window->DC.CursorPos.y;
    ItemsHeight = items_height;
    ItemsCount = count;
    StepNo = 0;
    DisplayEnd = DisplayStart = -1;
    if (ItemsHeight > 0.0f)
    {
        ImGui::CalcListClipping(ItemsCount, ItemsHeight, &DisplayStart, &DisplayEnd); // calculate how many to clip/display
        if (DisplayStart > 0)
            SetCursorPosYAndSetupDummyPrevLine(StartPosY + DisplayStart * ItemsHeight, ItemsHeight); // advance cursor
        StepNo = 2;
    }
}